

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

int lyxml_dump_text(lyout *out,char *text)

{
  char cVar1;
  int iVar2;
  char *format;
  ulong uVar3;
  int iVar4;
  
  if (text == (char *)0x0) {
    return 0;
  }
  uVar3 = 0;
  iVar4 = 0;
  do {
    cVar1 = text[uVar3];
    if (cVar1 == '\"') {
      format = "&quot;";
LAB_00120901:
      iVar2 = ly_print(out,format);
      iVar4 = iVar4 + iVar2;
    }
    else {
      if (cVar1 == '&') {
        format = "&amp;";
        goto LAB_00120901;
      }
      if (cVar1 == '<') {
        format = "&lt;";
        goto LAB_00120901;
      }
      if (cVar1 == '>') {
        format = "&gt;";
        goto LAB_00120901;
      }
      if (cVar1 == '\0') {
        return iVar4;
      }
      ly_write(out,text + uVar3,1);
      iVar4 = iVar4 + 1;
    }
    uVar3 = (ulong)((int)uVar3 + 1);
  } while( true );
}

Assistant:

int
lyxml_dump_text(struct lyout *out, const char *text)
{
    unsigned int i, n;

    if (!text) {
        return 0;
    }

    for (i = n = 0; text[i]; i++) {
        switch (text[i]) {
        case '&':
            n += ly_print(out, "&amp;");
            break;
        case '<':
            n += ly_print(out, "&lt;");
            break;
        case '>':
            /* not needed, just for readability */
            n += ly_print(out, "&gt;");
            break;
        case '"':
            n += ly_print(out, "&quot;");
            break;
        default:
            ly_write(out, &text[i], 1);
            n++;
        }
    }

    return n;
}